

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

ImVec2 ImGui::FindBestWindowPosForPopupEx
                 (ImVec2 *ref_pos,ImVec2 *size,ImGuiDir *last_dir,ImRect *r_outer,ImRect *r_avoid,
                 ImGuiPopupPositionPolicy policy)

{
  undefined8 uVar1;
  ImGuiDir IVar2;
  ImGuiDir IVar3;
  undefined4 in_EAX;
  uint uVar4;
  ImGuiDir *pIVar5;
  ulong uVar6;
  ImGuiDir *pIVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  ImVec2 IVar11;
  ImVec2 IVar12;
  ImVec2 IVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar22;
  float fVar23;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar24;
  float fVar25;
  float fVar26;
  ImVec2 IVar27;
  float fVar28;
  float fVar29;
  
  fVar24 = (r_outer->Max).x;
  fVar19 = (*size).x;
  fVar23 = (*size).y;
  fVar25 = (r_outer->Max).y - fVar23;
  fVar18 = (*ref_pos).x;
  fVar22 = (*ref_pos).y;
  iVar8 = -(uint)(fVar24 - fVar19 < fVar18);
  iVar9 = -(uint)(fVar25 < fVar22);
  auVar14._4_4_ = iVar9;
  auVar14._0_4_ = iVar8;
  auVar14._8_4_ = iVar9;
  auVar14._12_4_ = iVar9;
  auVar21._8_8_ = auVar14._8_8_;
  auVar21._4_4_ = iVar8;
  auVar21._0_4_ = iVar8;
  uVar4 = movmskpd(in_EAX,auVar21);
  fVar26 = fVar24 - fVar19;
  if ((uVar4 & 1) == 0) {
    fVar26 = fVar18;
  }
  if ((uVar4 & 2) == 0) {
    fVar25 = fVar22;
  }
  fVar16 = (r_outer->Min).x;
  fVar17 = (r_outer->Min).y;
  if (policy == ImGuiPopupPositionPolicy_ComboBox) {
    IVar2 = *last_dir;
    uVar6 = (ulong)(IVar2 == ImGuiDir_None);
    uVar1 = *(undefined8 *)&(r_avoid->Min).y;
    IVar27.x = (float)((ulong)uVar1 >> 0x20) - fVar19;
    IVar27.y = (float)uVar1 - fVar23;
    fVar29 = (r_avoid->Max).y;
    IVar12.x = (*r_avoid).Min;
    pIVar7 = (ImGuiDir *)(&DAT_001f57c0 + (ulong)(IVar2 != ImGuiDir_None) * -4);
    do {
      pIVar5 = last_dir;
      if (uVar6 != 0) {
        pIVar5 = pIVar7;
      }
      IVar3 = *pIVar5;
      if ((uVar6 == 0) || (IVar3 != IVar2)) {
        switch(IVar3) {
        case ImGuiDir_Left:
          IVar11.y = fVar29;
          IVar11.x = (r_avoid->Max).x - fVar19;
          break;
        case ImGuiDir_Right:
          IVar11.y = (r_avoid->Min).y - fVar23;
          IVar11.x = IVar12.x;
          break;
        case ImGuiDir_Up:
          IVar11 = IVar27;
          break;
        case ImGuiDir_Down:
          IVar12.y = fVar29;
          IVar11 = IVar12;
          break;
        default:
          IVar11.x = 0.0;
          IVar11.y = 0.0;
        }
        if ((((fVar16 <= IVar11.x) && (fVar17 <= IVar11.y)) && (fVar19 + IVar11.x <= fVar24)) &&
           (IVar11.y + fVar23 <= (r_outer->Max).y)) {
          *last_dir = IVar3;
          return IVar11;
        }
      }
      uVar6 = uVar6 + 1;
      pIVar7 = pIVar7 + 1;
    } while (uVar6 != 5);
  }
  if ((policy & ~ImGuiPopupPositionPolicy_Tooltip) == ImGuiPopupPositionPolicy_Default) {
    fVar26 = (float)(-(uint)(fVar18 < fVar16) & (uint)fVar16 |
                    ~-(uint)(fVar18 < fVar16) & (uint)fVar26);
    fVar25 = (float)(-(uint)(fVar22 < fVar17) & (uint)fVar17 |
                    ~-(uint)(fVar22 < fVar17) & (uint)fVar25);
    IVar2 = *last_dir;
    uVar6 = (ulong)(IVar2 == ImGuiDir_None);
    pIVar7 = (ImGuiDir *)(&DAT_001f9900 + (ulong)(IVar2 != ImGuiDir_None) * -4);
    do {
      pIVar5 = last_dir;
      if (uVar6 != 0) {
        pIVar5 = pIVar7;
      }
      IVar3 = *pIVar5;
      if ((uVar6 == 0) || (IVar3 != IVar2)) {
        fVar29 = (r_avoid->Min).x;
        if (IVar3 != ImGuiDir_Left) {
          fVar29 = (r_outer->Max).x;
        }
        fVar28 = (r_avoid->Max).x;
        if (IVar3 != ImGuiDir_Right) {
          fVar28 = (r_outer->Min).x;
        }
        if (fVar19 <= fVar29 - fVar28 || 1 < (uint)IVar3) {
          fVar29 = (r_avoid->Min).y;
          if (IVar3 != ImGuiDir_Up) {
            fVar29 = (r_outer->Max).y;
          }
          fVar28 = (r_avoid->Max).y;
          if (IVar3 != ImGuiDir_Down) {
            fVar28 = (r_outer->Min).y;
          }
          if ((fVar23 <= fVar29 - fVar28) || ((IVar3 & ~ImGuiDir_Right) != ImGuiDir_Up)) {
            if (IVar3 == ImGuiDir_Left) {
              fVar26 = (r_avoid->Min).x - fVar19;
            }
            else if (IVar3 == ImGuiDir_Right) {
              fVar26 = (r_avoid->Max).x;
            }
            if (IVar3 == ImGuiDir_Up) {
              fVar25 = (r_avoid->Min).y - fVar23;
            }
            else if (IVar3 == ImGuiDir_Down) {
              fVar25 = (r_avoid->Max).y;
            }
            *last_dir = IVar3;
            return (ImVec2)(CONCAT44(~-(uint)(fVar17 <= fVar25) & (uint)fVar17,
                                     ~-(uint)(fVar16 <= fVar26) & (uint)fVar16) |
                           CONCAT44((uint)fVar25 & -(uint)(fVar17 <= fVar25),
                                    (uint)fVar26 & -(uint)(fVar16 <= fVar26)));
          }
        }
      }
      uVar6 = uVar6 + 1;
      pIVar7 = pIVar7 + 1;
    } while (uVar6 != 5);
  }
  *last_dir = ImGuiDir_None;
  if (policy == ImGuiPopupPositionPolicy_Tooltip) {
    IVar13.x = fVar18 + 2.0;
    IVar13.y = fVar22 + 2.0;
  }
  else {
    auVar20._0_4_ = (*ref_pos).x + fVar19;
    auVar20._4_4_ = (*ref_pos).y + fVar23;
    auVar20._8_8_ = 0;
    auVar15._4_4_ = (r_outer->Max).y;
    auVar15._0_4_ = fVar24;
    auVar15._8_8_ = 0;
    auVar21 = minps(auVar20,auVar15);
    fVar19 = auVar21._0_4_ - fVar19;
    fVar23 = auVar21._4_4_ - fVar23;
    uVar4 = -(uint)(fVar16 <= fVar19);
    uVar10 = -(uint)(fVar17 <= fVar23);
    IVar13 = (ImVec2)(CONCAT44(~uVar10 & (uint)fVar17,~uVar4 & (uint)fVar16) |
                     CONCAT44((uint)fVar23 & uVar10,(uint)fVar19 & uVar4));
  }
  return IVar13;
}

Assistant:

static inline ImVec2 ImClamp(const ImVec2& v, const ImVec2&mn, const ImVec2&mx) { return ImVec2((v.x < mn.x) ? mn.x : (v.x > mx.x) ? mx.x : v.x, (v.y < mn.y) ? mn.y : (v.y > mx.y) ? mx.y : v.y); }